

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O3

string * capitalize(string *__return_storage_ptr__,string *s,int pos)

{
  byte *pbVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  size_type sVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + s->_M_string_length);
  if (pos == -1) {
    sVar3 = __return_storage_ptr__->_M_string_length;
    if (sVar3 != 0) {
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sVar5 = 0;
      do {
        iVar4 = toupper((int)pcVar2[sVar5]);
        pcVar2[sVar5] = (char)iVar4;
        sVar5 = sVar5 + 1;
      } while (sVar3 != sVar5);
    }
  }
  else {
    pbVar1 = (byte *)((__return_storage_ptr__->_M_dataplus)._M_p + pos);
    *pbVar1 = *pbVar1 ^ 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string capitalize(const std::string &s, int pos) {
  std::string ret = s;
  if (pos == -1) {
      std::transform(ret.begin(), ret.end(),ret.begin(), ::toupper);
      return ret;
  }

  ret[pos] ^= 32;
  return ret;
}